

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O1

bool __thiscall FpgaIO::WaitRTL8211F_Idle(FpgaIO *this,char *callerName,uint chan,uint loop_cnt)

{
  BasePort *pBVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  bool bVar10;
  quadlet_t read_data;
  undefined1 local_40 [3];
  byte bStack_3d;
  int local_3c;
  char *local_38;
  
  Amp1394_Sleep(0.001);
  if (loop_cnt == 0) {
    bVar8 = false;
  }
  else {
    uVar9 = 1;
    local_3c = loop_cnt + 1;
    local_38 = callerName;
    bVar7 = false;
    do {
      pBVar1 = (this->super_BoardIO).port;
      iVar4 = (*pBVar1->_vptr_BasePort[0x23])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,(ulong)(chan << 8 | 0x40a0),
                         local_40);
      bVar8 = (bStack_3d & 7) == 0;
      if ((char)iVar4 == '\0') {
        bVar8 = bVar7;
      }
      callerName = local_38;
    } while ((!bVar8) && (bVar10 = uVar9 != loop_cnt, uVar9 = uVar9 + 1, bVar7 = bVar8, bVar10));
  }
  if (bVar8 == false) {
    if (callerName == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x11a198);
    }
    else {
      sVar5 = strlen(callerName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,callerName,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," timeout waiting for idle, cnt ",0x1f);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", read ",7);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    lVar2 = *(long *)poVar6;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar6 + lVar3 + 0x18) = *(uint *)(poVar6 + lVar3 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar2 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  return bVar8;
}

Assistant:

bool FpgaIO::WaitRTL8211F_Idle(const char *callerName, unsigned int chan, unsigned int loop_cnt)
{
    // Should have firmware/hardware checks
    // First, wait 1 millisecond
    Amp1394_Sleep(0.001);
    // Now, check up to loop_cnt iterations
    nodeaddr_t address = 0x40a0 | (chan << 8);
    quadlet_t read_data;
    bool isIdle = false;
    unsigned int i = 0;
    while (!isIdle && (i++ < loop_cnt)) {
        if (port->ReadQuadlet(BoardId, address, read_data))
            isIdle = ((read_data&0x07000000) == 0);
    }
    if (!isIdle) {
        std::cout << callerName << " timeout waiting for idle, cnt " << i << ", read " << std::hex
                  << read_data << std::dec << std::endl;
    }
    return isIdle;
}